

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O1

void GetLine(FILE *file,string *str_line)

{
  scoped_array<char> sVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  scoped_array<char> *this;
  scoped_array<char> line;
  undefined1 local_6c [4];
  scoped_array<char> local_68;
  string local_60;
  string local_40;
  
  if (file == (FILE *)0x0) {
    local_68.array_._0_4_ = 2;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"GetLine","");
    poVar5 = Logger::Start(ERR,&local_40,0xad,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xad);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"file",4);
    std::operator<<(poVar5," == NULL \n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    this = &local_68;
  }
  else {
    local_68.array_ = (char *)operator_new__(0xa00000);
    pcVar3 = fgets(local_68.array_,0xa00000,(FILE *)file);
    if (pcVar3 != (char *)0x0) {
      sVar4 = strlen(local_68.array_);
      iVar2 = (int)sVar4;
      pcVar3 = scoped_array<char>::operator[](&local_68,(long)(iVar2 + -1));
      if (*pcVar3 == '\n') {
        pcVar3 = scoped_array<char>::operator[](&local_68,(long)(iVar2 + -1));
        *pcVar3 = '\0';
        if (1 < iVar2) {
          pcVar3 = scoped_array<char>::operator[](&local_68,(ulong)(iVar2 - 2));
          if (*pcVar3 == '\r') {
            pcVar3 = scoped_array<char>::operator[](&local_68,(ulong)(iVar2 - 2));
            *pcVar3 = '\0';
          }
        }
      }
      else {
        local_6c = (undefined1  [4])0x3;
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                   ,"");
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"GetLine","");
        poVar5 = Logger::Start(FATAL,&local_40,0xb2,&local_60);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "Encountered a too-long line:                   Cannot find the \'\\n\' char.                     Please check the data."
                   ,0x74);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
        Logger::~Logger((Logger *)local_6c);
      }
      sVar1.array_ = local_68.array_;
      pcVar3 = (char *)str_line->_M_string_length;
      strlen(local_68.array_);
      std::__cxx11::string::_M_replace((ulong)str_line,0,pcVar3,(ulong)sVar1.array_);
      if (local_68.array_ != (char *)0x0) {
        operator_delete__(local_68.array_);
      }
      return;
    }
    local_6c = (undefined1  [4])0x2;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"GetLine","");
    poVar5 = Logger::Start(ERR,&local_40,0xaf,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xaf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"fgets(line.get(), kMaxLineSize, file)",0x25);
    std::operator<<(poVar5," == NULL \n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    this = (scoped_array<char> *)local_6c;
  }
  Logger::~Logger((Logger *)this);
  abort();
}

Assistant:

inline void GetLine(FILE *file, std::string &str_line) {
  CHECK_NOTNULL(file);
  scoped_array<char> line(new char[kMaxLineSize]);
  CHECK_NOTNULL(fgets(line.get(), kMaxLineSize, file));
  int read_len = strlen(line.get());
  if (line[read_len-1] != '\n') {
    LOG(FATAL) << "Encountered a too-long line: \
                  Cannot find the '\\n' char.   \
                  Please check the data.";
  } else {
    line[read_len-1] = '\0';
    // Handle the format in DOS and Windows
    if (read_len > 1 && line[read_len-2] == '\r') {
      line[read_len-2] = '\0';
    }
  }
  str_line.assign(line.get());
}